

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_set_format_filter_by_ext.c
# Opt level: O1

void test_format_filter_by_ext
               (char *output_file,int format_id,int filter_id,int dot_stored,char *def_ext)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  wchar_t wVar4;
  mode_t mVar5;
  uint uVar6;
  void *buff;
  archive *paVar7;
  char *pcVar8;
  time_t tVar9;
  la_ssize_t v2;
  la_int64_t v2_00;
  char *e1;
  char *v1;
  longlong v2_01;
  ulong v1_00;
  archive_entry *ae;
  size_t used;
  archive_entry *local_48;
  uint local_40;
  uint local_3c;
  size_t local_38;
  
  buff = malloc(0x100000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L'(',(uint)(buff != (void *)0x0),"(buff = malloc(buffsize)) != NULL",(void *)0x0
                  );
  if (buff == (void *)0x0) {
    return;
  }
  local_40 = format_id;
  local_3c = filter_id;
  paVar7 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L'-',(uint)(paVar7 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  if (def_ext == (char *)0x0) {
    iVar2 = archive_write_set_format_filter_by_ext(paVar7,output_file);
  }
  else {
    iVar2 = archive_write_set_format_filter_by_ext_def(paVar7,output_file,def_ext);
  }
  if (iVar2 == -0x1e) {
    pcVar8 = archive_error_string(paVar7);
    iVar3 = strcmp(pcVar8,"lzma compression not supported on this platform");
    if (iVar3 != 0) {
      pcVar8 = archive_error_string(paVar7);
      iVar3 = strcmp(pcVar8,"xz compression not supported on this platform");
      if (iVar3 != 0) goto LAB_00132c90;
    }
    pcVar8 = archive_filter_name(paVar7,0);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L'>');
    test_skipping("%s filter not supported on this platform",pcVar8);
    iVar2 = archive_write_free(paVar7);
    v2_01 = (longlong)iVar2;
    wVar4 = L'?';
  }
  else if (iVar2 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L'3');
    pcVar8 = archive_format_name(paVar7);
    test_skipping("%s format not fully supported on this platform",pcVar8);
    iVar2 = archive_write_free(paVar7);
    v2_01 = (longlong)iVar2;
    wVar4 = L'5';
  }
  else {
LAB_00132c90:
    wVar4 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                                ,L'C',0,"ARCHIVE_OK",(long)iVar2,"r",paVar7);
    if (wVar4 != L'\0') {
      iVar2 = archive_write_open_memory(paVar7,buff,0x100000,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'K',0,"ARCHIVE_OK",(long)iVar2,
                          "archive_write_open_memory(a, buff, buffsize, &used)",paVar7);
      local_48 = archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                       ,L'P',(uint)(local_48 != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_mtime(local_48,1,0);
      tVar9 = archive_entry_mtime(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'R',1,"1",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
      archive_entry_set_ctime(local_48,1,0);
      tVar9 = archive_entry_ctime(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'T',1,"1",tVar9,"archive_entry_ctime(ae)",(void *)0x0);
      archive_entry_set_atime(local_48,1,0);
      tVar9 = archive_entry_atime(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'V',1,"1",tVar9,"archive_entry_atime(ae)",(void *)0x0);
      archive_entry_copy_pathname(local_48,"file");
      pcVar8 = archive_entry_pathname(local_48);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                 ,L'X',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      archive_entry_set_mode(local_48,0x81ed);
      mVar5 = archive_entry_mode(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'Z',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar5,"archive_entry_mode(ae)",
                          (void *)0x0);
      archive_entry_set_size(local_48,8);
      iVar2 = archive_write_header(paVar7,local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\\',0,"0",(long)iVar2,"archive_write_header(a, ae)",(void *)0x0);
      archive_entry_free(local_48);
      v2 = archive_write_data(paVar7,"12345678",8);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'^',8,"8",v2,"archive_write_data(a, \"12345678\", 8)",(void *)0x0);
      iVar2 = archive_write_close(paVar7);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'a',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar7);
      iVar2 = archive_write_free(paVar7);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'b',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
      paVar7 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                       ,L'i',(uint)(paVar7 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar2 = archive_read_support_format_all(paVar7);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'k',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",
                          paVar7);
      iVar2 = archive_read_support_filter_all(paVar7);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'm',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",
                          paVar7);
      iVar2 = read_open_memory_seek(paVar7,buff,local_38,7);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'o',0,"ARCHIVE_OK",(long)iVar2,"read_open_memory_seek(a, buff, used, 7)"
                          ,paVar7);
      if ((dot_stored & 1U) != 0) {
        iVar2 = archive_read_next_header(paVar7,&local_48);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L's',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",
                            paVar7);
        pcVar8 = archive_entry_pathname(local_48);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                   ,L't',".","\".\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        mVar5 = archive_entry_filetype(local_48);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                            ,L'u',0x4000,"AE_IFDIR",(ulong)mVar5,"archive_entry_filetype(ae)",
                            (void *)0x0);
      }
      iVar2 = archive_read_next_header(paVar7,&local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'z',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar7
                         );
      tVar9 = archive_entry_mtime(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'{',1,"1",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar8 = archive_entry_pathname(local_48);
      if ((dot_stored & 2U) == 0) {
        v1 = "file";
        e1 = "\"file\"";
        wVar4 = L'\x7f';
      }
      else {
        v1 = "./file";
        e1 = "\"./file\"";
        wVar4 = L'}';
      }
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                 ,wVar4,v1,e1,pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      uVar1 = local_40;
      mVar5 = archive_entry_filetype(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x81',0x8000,"AE_IFREG",(ulong)mVar5,"archive_entry_filetype(ae)",
                          (void *)0x0);
      v2_00 = archive_entry_size(local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x82',8,"8",v2_00,"archive_entry_size(ae)",(void *)0x0);
      iVar2 = archive_read_next_header(paVar7,&local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x85',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",
                          paVar7);
      v1_00 = (ulong)local_3c;
      iVar2 = archive_filter_code(paVar7,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x89',v1_00,"filter_id",(long)iVar2,"archive_filter_code(a, 0)",paVar7)
      ;
      uVar6 = archive_format(paVar7);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x8a',(ulong)uVar1,"format_id",(ulong)(uVar6 & 0xff0000),
                          "archive_format(a) & ARCHIVE_FORMAT_BASE_MASK",paVar7);
      iVar2 = archive_read_close(paVar7);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                          ,L'\x8c',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",(void *)0x0);
      iVar2 = archive_read_free(paVar7);
      v2_01 = (longlong)iVar2;
      pcVar8 = "archive_read_free(a)";
      wVar4 = L'\x8d';
      goto LAB_00133392;
    }
    iVar2 = archive_write_free(paVar7);
    v2_01 = (longlong)iVar2;
    wVar4 = L'D';
  }
  pcVar8 = "archive_write_free(a)";
LAB_00133392:
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_format_filter_by_ext.c"
                      ,wVar4,0,"ARCHIVE_OK",v2_01,pcVar8,(void *)0x0);
  free(buff);
  return;
}

Assistant:

static void
test_format_filter_by_ext(const char *output_file, 
    int format_id, int filter_id, int dot_stored, const char * def_ext)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t buffsize = 1024 * 1024;
	char *buff;
	int r;

	assert((buff = malloc(buffsize)) != NULL);
	if (buff == NULL)
		return;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	if( def_ext == NULL)
          r = archive_write_set_format_filter_by_ext(a, output_file);
        else
          r = archive_write_set_format_filter_by_ext_def(a, output_file, def_ext);
	if (r == ARCHIVE_WARN) {
		skipping("%s format not fully supported on this platform",
		   archive_format_name(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
        } else if (r == ARCHIVE_FATAL &&
	    (strcmp(archive_error_string(a),
		   "lzma compression not supported on this platform") == 0 ||
	     strcmp(archive_error_string(a),
		   "xz compression not supported on this platform") == 0)) {
                const char *filter_name = archive_filter_name(a, 0);
		skipping("%s filter not supported on this platform", filter_name);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	} else {
		if (!assertEqualIntA(a, ARCHIVE_OK, r)) {
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			return;
		}
	}
        
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	assertEqualInt(1, archive_entry_mtime(ae));
	archive_entry_set_ctime(ae, 1, 0);
	assertEqualInt(1, archive_entry_ctime(ae));
	archive_entry_set_atime(ae, 1, 0);
	assertEqualInt(1, archive_entry_atime(ae));
	archive_entry_copy_pathname(ae, "file");
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 8));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	if (format_id > 0) {
		/*
		 * Now, read the data back.
		 */
		/* With the test memory reader -- seeking mode. */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    read_open_memory_seek(a, buff, used, 7));

		if (dot_stored & 1) {
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			assertEqualString(".", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
		}
		/*
		 * Read and verify the file.
		 */
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt(1, archive_entry_mtime(ae));
		if (dot_stored & 2) {
			assertEqualString("./file", archive_entry_pathname(ae));
		} else {
			assertEqualString("file", archive_entry_pathname(ae));
		}
		assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
		assertEqualInt(8, archive_entry_size(ae));

		/* Verify the end of the archive. */
		assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

		/* Verify archive format. */
		assertEqualIntA(a, filter_id,
		    archive_filter_code(a, 0));
		assertEqualIntA(a, format_id, archive_format(a) & ARCHIVE_FORMAT_BASE_MASK );

		assertEqualInt(ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
	free(buff);
}